

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int rsa_prepare_blinding
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int local_30;
  int local_2c;
  int count;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  local_30 = 0;
  if ((ctx->Vf).p == (mbedtls_mpi_uint *)0x0) {
    do {
      if (10 < local_30) {
        return -0x4480;
      }
      iVar1 = mbedtls_mpi_fill_random(&ctx->Vf,ctx->len - 1,f_rng,p_rng);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_mpi_gcd(&ctx->Vi,&ctx->Vf,&ctx->N);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_mpi_cmp_int(&ctx->Vi,1);
      local_30 = local_30 + 1;
    } while (iVar1 != 0);
    local_2c = mbedtls_mpi_inv_mod(&ctx->Vi,&ctx->Vf,&ctx->N);
    if (local_2c == 0) {
      local_2c = mbedtls_mpi_exp_mod(&ctx->Vi,&ctx->Vi,&ctx->E,&ctx->N,&ctx->RN);
    }
  }
  else {
    local_2c = mbedtls_mpi_mul_mpi(&ctx->Vi,&ctx->Vi,&ctx->Vi);
    if (((local_2c == 0) &&
        (local_2c = mbedtls_mpi_mod_mpi(&ctx->Vi,&ctx->Vi,&ctx->N), local_2c == 0)) &&
       (local_2c = mbedtls_mpi_mul_mpi(&ctx->Vf,&ctx->Vf,&ctx->Vf), local_2c == 0)) {
      local_2c = mbedtls_mpi_mod_mpi(&ctx->Vf,&ctx->Vf,&ctx->N);
    }
  }
  return local_2c;
}

Assistant:

static int rsa_prepare_blinding( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret, count = 0;

    if( ctx->Vf.p != NULL )
    {
        /* We already have blinding values, just update them by squaring */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->Vi, &ctx->Vi, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->Vi, &ctx->Vi, &ctx->N ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->Vf, &ctx->Vf, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->Vf, &ctx->Vf, &ctx->N ) );

        goto cleanup;
    }

    /* Unblinding value: Vf = random number, invertible mod N */
    do {
        if( count++ > 10 )
            return( MBEDTLS_ERR_RSA_RNG_FAILED );

        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &ctx->Vf, ctx->len - 1, f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &ctx->Vi, &ctx->Vf, &ctx->N ) );
    } while( mbedtls_mpi_cmp_int( &ctx->Vi, 1 ) != 0 );

    /* Blinding value: Vi =  Vf^(-e) mod N */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &ctx->Vi, &ctx->Vf, &ctx->N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->Vi, &ctx->Vi, &ctx->E, &ctx->N, &ctx->RN ) );


cleanup:
    return( ret );
}